

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::detail::getTlsOssResult(void)

{
  String *in_RDI;
  char *local_30 [4];
  
  g_infoContexts::__tls_init();
  std::__cxx11::stringbuf::str();
  String::String(in_RDI,local_30[0]);
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

String getTlsOssResult() {
        //g_oss << std::ends; // needed - as shown here: https://stackoverflow.com/a/624291/3162383
        return g_oss.str().c_str();
    }